

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001716c0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001716c7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001716b0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001716b8 = 0x2d2d2d2d2d2d2d;
    DAT_001716bf = 0x2d;
    _DAT_001716a0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001716a8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_00171690 = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000171698 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam0000000000171688 = 0x2d2d2d2d2d2d2d2d;
    DAT_001716cf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }